

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chai-serialization.hpp
# Opt level: O2

void henson::Serialization<chaiscript::Boxed_Value>::load(BinaryBuffer *bb,Boxed_Value *bv)

{
  runtime_error *this;
  size_type *this_00;
  int i;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  string s;
  element_type *in_stack_ffffffffffffffd0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  int tag;
  
  (*bb->_vptr_BinaryBuffer[1])(bb,&tag,4);
  switch(tag) {
  case 0:
    (*bb->_vptr_BinaryBuffer[1])(bb,&i,4);
    chaiscript::Boxed_Value::Object_Data::get<int>((int)s._M_dataplus._M_p._4_4_,false);
    break;
  case 1:
    (*bb->_vptr_BinaryBuffer[1])(bb,&i,4);
    chaiscript::Boxed_Value::Object_Data::get<float>(s._M_dataplus._M_p._4_4_,false);
    break;
  case 2:
    (*bb->_vptr_BinaryBuffer[1])(bb,&i,8);
    chaiscript::Boxed_Value::Object_Data::get<double>((double)in_stack_ffffffffffffffd0,false);
    break;
  case 3:
    (*bb->_vptr_BinaryBuffer[1])(bb,&i,8);
    chaiscript::Boxed_Value::Object_Data::get<unsigned_long>
              ((unsigned_long)in_stack_ffffffffffffffd0,false);
    break;
  case 4:
    s._M_dataplus._M_p = (pointer)&s.field_2;
    s._M_string_length = 0;
    s.field_2._M_allocated_capacity = s.field_2._M_allocated_capacity & 0xffffffffffffff00;
    Serialization<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::load(bb,&s);
    chaiscript::Boxed_Value::Boxed_Value<std::__cxx11::string&,void>((Boxed_Value *)&i,&s,false);
    std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)bv,
               (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)&i);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
    std::__cxx11::string::~string((string *)&s);
    return;
  case 5:
    s._M_dataplus._M_p = (pointer)0x0;
    s._M_string_length = s._M_string_length & 0xffffffff00000000;
    s.field_2._M_allocated_capacity = 0;
    s.field_2._8_8_ = 0;
    local_28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Serialization<henson::Array>::load(bb,(Array *)&s);
    chaiscript::Boxed_Value::Boxed_Value<henson::Array&,void>((Boxed_Value *)&i,(Array *)&s,false);
    std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)bv,
               (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)&i);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
    this_00 = (size_type *)&local_28;
    goto LAB_001d4374;
  case 6:
    s._M_dataplus._M_p = (pointer)0x0;
    s._M_string_length = 0;
    s.field_2._M_allocated_capacity = 0;
    Serialization<std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>::
    load(bb,(Vector *)&s);
    chaiscript::Boxed_Value::
    Boxed_Value<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>&,void>
              ((Boxed_Value *)&i,
               (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)&s,false
              );
    std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)bv,
               (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)&i);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
              ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)&s);
    return;
  case 7:
    chaiscript::Boxed_Value::Object_Data::get();
    break;
  default:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Cannot deserialize a boxed value");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)bv,
             (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)&s);
  this_00 = &s._M_string_length;
LAB_001d4374:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00);
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, chaiscript::Boxed_Value& bv)
        {
            int tag;
            henson::load(bb, tag);
            if (tag == tags::int_)
            {
                int i;
                henson::load(bb, i);
                bv = chaiscript::Boxed_Value(i);
            } else if (tag == tags::float_)
            {
                float f;
                henson::load(bb, f);
                bv = chaiscript::Boxed_Value(f);
            } else if (tag == tags::double_)
            {
                double d;
                henson::load(bb, d);
                bv = chaiscript::Boxed_Value(d);
            } else if (tag == tags::size_t_)
            {
                size_t s;
                henson::load(bb, s);
                bv = chaiscript::Boxed_Value(s);
            } else if (tag == tags::string_)
            {
                std::string s;
                henson::load(bb, s);
                bv = chaiscript::Boxed_Value(s);
            } else if (tag == tags::vector_)
            {
                std::vector<chaiscript::Boxed_Value> v;
                henson::load(bb, v);
                bv = chaiscript::Boxed_Value(v);
            } else if (tag == tags::array_)
            {
                Array a;
                henson::load(bb, a);
                bv = chaiscript::Boxed_Value(a);
            } else if (tag == tags::undef_)
                bv = chaiscript::Boxed_Value();
            else
                throw std::runtime_error("Cannot deserialize a boxed value");
        }